

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::Pass::GetNullId(Pass *this,uint32_t type_id)

{
  Type *this_00;
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  Type *type_00;
  Constant *c;
  Instruction *this_01;
  Instruction *null_inst;
  Constant *local_38;
  Constant *null_const;
  Type *type;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  Pass *pPStack_10;
  uint32_t type_id_local;
  Pass *this_local;
  
  type_mgr._4_4_ = type_id;
  pPStack_10 = this;
  bVar1 = IsFloat(this,type_id,0x10);
  if (bVar1) {
    pIVar3 = context(this);
    IRContext::AddCapability(pIVar3,CapabilityFloat16);
  }
  pIVar3 = context(this);
  const_mgr = (ConstantManager *)IRContext::get_type_mgr(pIVar3);
  pIVar3 = context(this);
  type = (Type *)IRContext::get_constant_mgr(pIVar3);
  type_00 = analysis::TypeManager::GetType((TypeManager *)const_mgr,type_mgr._4_4_);
  this_00 = type;
  null_const = (Constant *)type_00;
  memset(&null_inst,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&null_inst);
  c = analysis::ConstantManager::GetConstant
                ((ConstantManager *)this_00,type_00,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&null_inst);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&null_inst);
  local_38 = c;
  this_01 = analysis::ConstantManager::GetDefiningInstruction
                      ((ConstantManager *)type,c,type_mgr._4_4_,(inst_iterator *)0x0);
  uVar2 = opt::Instruction::result_id(this_01);
  return uVar2;
}

Assistant:

uint32_t Pass::GetNullId(uint32_t type_id) {
  if (IsFloat(type_id, 16)) context()->AddCapability(spv::Capability::Float16);
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Type* type = type_mgr->GetType(type_id);
  const analysis::Constant* null_const = const_mgr->GetConstant(type, {});
  Instruction* null_inst =
      const_mgr->GetDefiningInstruction(null_const, type_id);
  return null_inst->result_id();
}